

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O0

bool __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::verifyDepth16Data
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,_texture_size *texture_size,
          GLuint n_layer)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ulong uVar6;
  unsigned_short *image;
  GLushort *result_data;
  GLuint result_data_size;
  bool result;
  Functions *gl;
  GLushort expected_value;
  _texture_size *p_Stack_18;
  GLuint n_layer_local;
  _texture_size *texture_size_local;
  TextureCubeMapArrayColorDepthAttachmentsTest *this_local;
  long lVar5;
  
  gl._2_2_ = (undefined2)n_layer;
  gl._4_4_ = n_layer;
  p_Stack_18 = texture_size;
  texture_size_local = (_texture_size *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  auVar1 = ZEXT416(p_Stack_18->m_size * p_Stack_18->m_size) * ZEXT816(2);
  uVar6 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  image = (unsigned_short *)operator_new__(uVar6);
  (**(code **)(lVar5 + 0xff0))(0xd05,2);
  (**(code **)(lVar5 + 0x1220))
            (0,0,p_Stack_18->m_size,p_Stack_18->m_size,0x1902,this->m_depth_type,image);
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"glReadPixels() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x441);
  bVar2 = verifyImage<unsigned_short,1u>
                    (p_Stack_18->m_size,p_Stack_18->m_size,(unsigned_short *)((long)&gl + 2),image);
  if ((image != (unsigned_short *)0x0) && (image != (unsigned_short *)0x0)) {
    operator_delete__(image);
  }
  (**(code **)(lVar5 + 0xff0))(0xd05,4);
  return bVar2;
}

Assistant:

bool TextureCubeMapArrayColorDepthAttachmentsTest::verifyDepth16Data(const _texture_size& texture_size,
																	 glw::GLuint		  n_layer)
{
	/* Allocate buffer for the data we will retrieve from the implementation */
	glw::GLushort		  expected_value   = (glw::GLushort)n_layer;
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	bool				  result		   = false;
	const glw::GLuint	 result_data_size = texture_size.m_size * texture_size.m_size;
	glw::GLushort*		  result_data	  = new glw::GLushort[result_data_size];

	DE_ASSERT(result_data != NULL);

	gl.pixelStorei(GL_PACK_ALIGNMENT, 2);

	/* Read the data */
	gl.readPixels(0, /* x */
				  0, /* y */
				  texture_size.m_size, texture_size.m_size, m_depth_format, m_depth_type, result_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed");

	/* Verify image, expected value is layer index */
	result = verifyImage<glw::GLushort, 1>(texture_size.m_size, texture_size.m_size, &expected_value, result_data);

	/* Release the buffer */
	if (result_data != NULL)
	{
		delete[] result_data;

		result_data = NULL;
	}

	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);

	return result;
}